

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  ZSTD_ErrorCode ZVar5;
  ZSTD_DDict *pZVar6;
  ZSTD_DDict *__n;
  ZSTD_DDict *pZVar7;
  XXH64_hash_t XVar8;
  void *pvVar9;
  ZSTD_DDict *pZVar10;
  ZSTD_DDict *pZVar11;
  ZSTD_DDict *src_00;
  ZSTD_DDict *pZVar12;
  size_t err_code;
  ZSTD_DDict *pZVar13;
  ZSTD_DDict *pZVar14;
  blockProperties_t local_64;
  size_t local_58;
  ZSTD_DDict *local_50;
  void *local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_40 = dictSize;
  local_50 = (ZSTD_DDict *)dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_50 = (ZSTD_DDict *)ZSTD_DDict_dictContent(ddict);
    local_40 = ZSTD_DDict_dictSize(ddict);
  }
  pvVar9 = dst;
  if (4 < srcSize) {
    local_38 = 0;
    pZVar14 = (ZSTD_DDict *)srcSize;
    local_58 = dstCapacity;
    do {
      while (((ulong)((ZSTD_DDict *)src)->dictBuffer & 0xfffffff0) != 0x184d2a50) {
        if (ddict == (ZSTD_DDict *)0x0) {
          pZVar13 = local_50;
          pZVar6 = (ZSTD_DDict *)ZSTD_decompressBegin_usingDict(dctx,local_50,local_40);
          if ((ZSTD_DDict *)0xffffffffffffff88 < pZVar6) {
            return (size_t)pZVar6;
          }
        }
        else {
          pZVar13 = ddict;
          ZSTD_decompressBegin_usingDDict(dctx,ddict);
        }
        pZVar6 = (ZSTD_DDict *)dctx->previousDstEnd;
        if (pZVar6 != (ZSTD_DDict *)dst) {
          dctx->dictEnd = pZVar6;
          dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pZVar6) + (long)dst);
          dctx->prefixStart = dst;
          dctx->previousDstEnd = dst;
        }
        local_48 = pvVar9;
        pZVar6 = (ZSTD_DDict *)src;
        srcSize = (size_t)pZVar14;
        if (pZVar14 < (ZSTD_DDict *)0x9) {
LAB_0014b395:
          __n = (ZSTD_DDict *)0xffffffffffffffb8;
        }
        else {
          bVar2 = *(byte *)((long)&((ZSTD_DDict *)src)->dictBuffer + 4);
          pZVar13 = (ZSTD_DDict *)0x0;
          lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
                  *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
                  (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5))
          ;
          pZVar10 = (ZSTD_DDict *)(lVar1 + 5);
          __n = pZVar10;
          if (pZVar10 < (ZSTD_DDict *)0xffffffffffffff89) {
            if (pZVar14 < (ZSTD_DDict *)(lVar1 + 8U)) goto LAB_0014b395;
            pZVar13 = (ZSTD_DDict *)src;
            __n = (ZSTD_DDict *)ZSTD_decodeFrameHeader(dctx,src,(size_t)pZVar10);
            if (__n < (ZSTD_DDict *)0xffffffffffffff89) {
              src_00 = (ZSTD_DDict *)
                       ((long)((((ZSTD_DDict *)((long)src + -0x6860))->entropy).hufTable + 0x600) +
                       (long)(pZVar10->entropy).hufTable);
              pZVar10 = (ZSTD_DDict *)((long)pZVar14 - (long)pZVar10);
              pZVar13 = pZVar10;
              pZVar7 = (ZSTD_DDict *)ZSTD_getcBlockSize(src_00,(size_t)pZVar10,&local_64);
              sVar4 = local_58;
              pZVar12 = (ZSTD_DDict *)dst;
              while (__n = pZVar7, pZVar7 < (ZSTD_DDict *)0xffffffffffffff89) {
                pZVar11 = (ZSTD_DDict *)((long)&pZVar10[-1].cMem.opaque + 5);
                pZVar10 = (ZSTD_DDict *)((long)pZVar11 - (long)pZVar7);
                if (pZVar11 < pZVar7) goto LAB_0014b395;
                pZVar11 = (ZSTD_DDict *)((long)&src_00->dictBuffer + 3);
                if (local_64.blockType == bt_compressed) {
                  pZVar13 = pZVar12;
                  __n = (ZSTD_DDict *)
                        ZSTD_decompressBlock_internal
                                  (dctx,pZVar12,(long)dst + (sVar4 - (long)pZVar12),pZVar11,
                                   (size_t)pZVar7,1);
                  if ((ZSTD_DDict *)0xffffffffffffff88 < __n) break;
                }
                else if (local_64.blockType == bt_rle) {
                  __n = (ZSTD_DDict *)(ulong)local_64.origSize;
                  if (pZVar12 == (ZSTD_DDict *)0x0) {
joined_r0x0014b522:
                    if (__n != (ZSTD_DDict *)0x0) {
                      __n = (ZSTD_DDict *)0xffffffffffffffb6;
                      break;
                    }
                    __n = (ZSTD_DDict *)0x0;
                  }
                  else {
                    if ((ZSTD_DDict *)((long)dst + (sVar4 - (long)pZVar12)) < __n) {
LAB_0014b651:
                      __n = (ZSTD_DDict *)0xffffffffffffffba;
                      break;
                    }
                    pZVar13 = (ZSTD_DDict *)0x0;
                    memset(pZVar12,(uint)*(byte *)&pZVar11->dictBuffer,(size_t)__n);
                  }
                }
                else {
                  if (local_64.blockType != bt_raw) {
                    __n = (ZSTD_DDict *)0xffffffffffffffec;
                    break;
                  }
                  if (pZVar12 == (ZSTD_DDict *)0x0) goto joined_r0x0014b522;
                  if ((ZSTD_DDict *)((long)dst + (sVar4 - (long)pZVar12)) < pZVar7)
                  goto LAB_0014b651;
                  memcpy(pZVar12,pZVar11,(size_t)pZVar7);
                  pZVar13 = pZVar11;
                }
                if ((dctx->fParams).checksumFlag != 0) {
                  pZVar13 = pZVar12;
                  XXH64_update(&dctx->xxhState,pZVar12,(size_t)__n);
                }
                pZVar12 = (ZSTD_DDict *)
                          ((long)(pZVar12[-1].entropy.hufTable + 0x600) +
                          (long)(__n->entropy).hufTable);
                src_00 = (ZSTD_DDict *)
                         ((long)&src_00->dictBuffer + -0x282d + (long)(pZVar7->entropy).hufTable);
                if (local_64.lastBlock != 0) {
                  pZVar7 = (ZSTD_DDict *)(dctx->fParams).frameContentSize;
                  pZVar12 = (ZSTD_DDict *)((long)pZVar12 - (long)dst);
                  if (((pZVar7 == (ZSTD_DDict *)0xffffffffffffffff) ||
                      (__n = (ZSTD_DDict *)0xffffffffffffffec, pZVar12 == pZVar7)) &&
                     (__n = pZVar12, pZVar6 = src_00, srcSize = (size_t)pZVar10,
                     (dctx->fParams).checksumFlag != 0)) {
                    XVar8 = XXH64_digest(&dctx->xxhState);
                    __n = (ZSTD_DDict *)0xffffffffffffffea;
                    pZVar6 = (ZSTD_DDict *)src;
                    srcSize = (size_t)pZVar14;
                    if (((ZSTD_DDict *)0x3 < pZVar10) && (*(int *)&src_00->dictBuffer == (int)XVar8)
                       ) {
                      __n = pZVar12;
                      pZVar6 = (ZSTD_DDict *)((long)&src_00->dictBuffer + 4);
                      srcSize = (size_t)((long)&pZVar10[-1].cMem.opaque + 4);
                    }
                  }
                  break;
                }
                pZVar13 = pZVar10;
                pZVar7 = (ZSTD_DDict *)ZSTD_getcBlockSize(src_00,(size_t)pZVar10,&local_64);
              }
            }
          }
        }
        ZVar5 = ZSTD_getErrorCode((size_t)__n);
        if (((byte)local_38 & ZVar5 == ZSTD_error_prefix_unknown) != 0) {
          return (size_t)(ZSTD_DDict *)0xffffffffffffffb8;
        }
        if ((ZSTD_DDict *)0xffffffffffffff88 < __n) {
          return (size_t)__n;
        }
        dst = (void *)((long)((((ZSTD_DDict *)((long)dst + -0x6860))->entropy).hufTable + 0x600) +
                      (long)(__n->entropy).hufTable);
        local_58 = local_58 - (long)__n;
        local_38 = CONCAT71((int7)((ulong)pZVar13 >> 8),1);
        pvVar9 = local_48;
        src = pZVar6;
        pZVar14 = (ZSTD_DDict *)srcSize;
        if (srcSize < (ZSTD_DDict *)0x5) goto LAB_0014b688;
      }
      if (pZVar14 < (ZSTD_DDict *)0x8) {
        return (size_t)(ZSTD_DDict *)0xffffffffffffffb8;
      }
      uVar3 = *(uint *)((long)&((ZSTD_DDict *)src)->dictBuffer + 4);
      if (0x1ffffffe < uVar3 >> 3) {
        return (size_t)(ZSTD_DDict *)0xfffffffffffffff2;
      }
      pZVar13 = (ZSTD_DDict *)((ulong)uVar3 + 8);
      if (pZVar14 < pZVar13) {
        pZVar13 = (ZSTD_DDict *)0xffffffffffffffb8;
      }
      if ((ZSTD_DDict *)0xffffffffffffff88 < pZVar13) {
        return (size_t)pZVar13;
      }
      srcSize = (long)pZVar14 - (long)pZVar13;
      src = (ZSTD_DDict *)
            ((long)((((ZSTD_DDict *)((long)src + -0x6860))->entropy).hufTable + 0x600) +
            (long)(pZVar13->entropy).hufTable);
      pZVar14 = (ZSTD_DDict *)srcSize;
    } while ((ZSTD_DDict *)0x4 < srcSize);
  }
LAB_0014b688:
  pZVar14 = (ZSTD_DDict *)0xffffffffffffffb8;
  if ((ZSTD_DDict *)srcSize == (ZSTD_DDict *)0x0) {
    pZVar14 = (ZSTD_DDict *)((long)dst - (long)pvVar9);
  }
  return (size_t)pZVar14;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize);
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "at least one frame successfully completed, but following "
                "bytes are garbage: it's more likely to be a srcSize error, "
                "specifying more bytes than compressed size of frame(s). This "
                "error message replaces ERROR(prefix_unknown), which would be "
                "confusing, as the first header is actually correct. Note that "
                "one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic "
                "bytes. But this is _much_ less likely than a srcSize field "
                "error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (BYTE*)dst - (BYTE*)dststart;
}